

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

opj_bool opj_event_msg(opj_common_ptr cinfo,int event_type,char *fmt,...)

{
  code *pcVar1;
  char in_AL;
  undefined8 in_RCX;
  long lVar2;
  opj_bool oVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  char message [512];
  undefined8 local_2f8;
  void **local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2d8 [24];
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  char local_228 [512];
  
  if (in_AL != '\0') {
    local_2a8 = in_XMM0_Qa;
    local_298 = in_XMM1_Qa;
    local_288 = in_XMM2_Qa;
    local_278 = in_XMM3_Qa;
    local_268 = in_XMM4_Qa;
    local_258 = in_XMM5_Qa;
    local_248 = in_XMM6_Qa;
    local_238 = in_XMM7_Qa;
  }
  oVar3 = 0;
  if (cinfo->event_mgr != (opj_event_mgr_t *)0x0) {
    if (event_type == 1) {
      lVar2 = 8;
    }
    else if (event_type == 4) {
      lVar2 = 0x18;
    }
    else {
      if (event_type != 2) {
        return 0;
      }
      lVar2 = 0x10;
    }
    pcVar1 = *(code **)((long)&cinfo->event_mgr->client_data + lVar2);
    oVar3 = 0;
    if ((pcVar1 != (code *)0x0) && (oVar3 = 1, fmt != (char *)0x0)) {
      local_2c0 = in_RCX;
      local_2b8 = in_R8;
      local_2b0 = in_R9;
      memset(local_228,0,0x200);
      local_2f8 = 0x3000000018;
      local_2f0 = &arg[0].overflow_arg_area;
      local_2e8 = local_2d8;
      vsprintf(local_228,fmt,&local_2f8);
      (*pcVar1)(local_228,cinfo->client_data);
    }
  }
  return oVar3;
}

Assistant:

opj_bool opj_event_msg(opj_common_ptr cinfo, int event_type, const char *fmt, ...) {
#define MSG_SIZE 512 /* 512 bytes should be more than enough for a short message */
	opj_msg_callback msg_handler = NULL;

	opj_event_mgr_t *event_mgr = cinfo->event_mgr;
	if(event_mgr != NULL) {
		switch(event_type) {
			case EVT_ERROR:
				msg_handler = event_mgr->error_handler;
				break;
			case EVT_WARNING:
				msg_handler = event_mgr->warning_handler;
				break;
			case EVT_INFO:
				msg_handler = event_mgr->info_handler;
				break;
			default:
				break;
		}
		if(msg_handler == NULL) {
			return OPJ_FALSE;
		}
	} else {
		return OPJ_FALSE;
	}

	if ((fmt != NULL) && (event_mgr != NULL)) {
		va_list arg;
		int str_length/*, i, j*/; /* UniPG */
		char message[MSG_SIZE];
		memset(message, 0, MSG_SIZE);
		/* initialize the optional parameter list */
		va_start(arg, fmt);
		/* check the length of the format string */
		str_length = (strlen(fmt) > MSG_SIZE) ? MSG_SIZE : strlen(fmt);
		/* parse the format string and put the result in 'message' */
		vsprintf(message, fmt, arg); /* UniPG */
		/* deinitialize the optional parameter list */
		va_end(arg);

		/* output the message to the user program */
		msg_handler(message, cinfo->client_data);
	}

	return OPJ_TRUE;
}